

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

mp_limb_t mpn_mul(mp_ptr rp,mp_srcptr up,mp_size_t un,mp_srcptr vp,mp_size_t vn)

{
  mp_limb_t mVar1;
  mp_ptr pmVar2;
  long lVar3;
  mp_limb_t *pmVar4;
  
  if (un < vn) {
    __assert_fail("un >= vn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x241,"mp_limb_t mpn_mul(mp_ptr, mp_srcptr, mp_size_t, mp_srcptr, mp_size_t)");
  }
  if (vn < 1) {
    __assert_fail("vn >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x242,"mp_limb_t mpn_mul(mp_ptr, mp_srcptr, mp_size_t, mp_srcptr, mp_size_t)");
  }
  mVar1 = mpn_mul_1(rp,up,un,*vp);
  rp[un] = mVar1;
  if (vn != 1) {
    lVar3 = vn + 1;
    pmVar4 = vp + 1;
    pmVar2 = rp;
    do {
      rp = pmVar2 + 1;
      mVar1 = mpn_addmul_1(rp,up,un,*pmVar4);
      pmVar2[un + 1] = mVar1;
      lVar3 = lVar3 + -1;
      pmVar4 = pmVar4 + 1;
      pmVar2 = rp;
    } while (2 < lVar3);
  }
  return rp[un];
}

Assistant:

mp_limb_t
mpn_mul (mp_ptr rp, mp_srcptr up, mp_size_t un, mp_srcptr vp, mp_size_t vn)
{
  assert (un >= vn);
  assert (vn >= 1);

  /* We first multiply by the low order limb. This result can be
     stored, not added, to rp. We also avoid a loop for zeroing this
     way. */

  rp[un] = mpn_mul_1 (rp, up, un, vp[0]);

  /* Now accumulate the product of up[] and the next higher limb from
     vp[]. */

  while (--vn >= 1)
    {
      rp += 1, vp += 1;
      rp[un] = mpn_addmul_1 (rp, up, un, vp[0]);
    }
  return rp[un];
}